

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ComputeResponse(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
               string *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *cookie,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *clientNonce,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serverNonce)

{
  CSHA256 *this;
  long lVar1;
  uchar *puVar2;
  long in_FS_OFFSET;
  allocator_type local_fa;
  value_type_conflict local_f9;
  CHMAC_SHA256 computeHash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CHMAC_SHA256::CHMAC_SHA256(&computeHash,(uchar *)(key->_M_dataplus)._M_p,key->_M_string_length);
  local_f9 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x20,&local_f9,&local_fa);
  puVar2 = (cookie->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this = &computeHash.inner;
  CSHA256::Write(this,puVar2,
                 (long)(cookie->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)puVar2);
  puVar2 = (clientNonce->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  CSHA256::Write(this,puVar2,
                 (long)(clientNonce->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2);
  puVar2 = (serverNonce->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  CSHA256::Write(this,puVar2,
                 (long)(serverNonce->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar2);
  CHMAC_SHA256::Finalize
            (&computeHash,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<uint8_t> ComputeResponse(const std::string &key, const std::vector<uint8_t> &cookie,  const std::vector<uint8_t> &clientNonce, const std::vector<uint8_t> &serverNonce)
{
    CHMAC_SHA256 computeHash((const uint8_t*)key.data(), key.size());
    std::vector<uint8_t> computedHash(CHMAC_SHA256::OUTPUT_SIZE, 0);
    computeHash.Write(cookie.data(), cookie.size());
    computeHash.Write(clientNonce.data(), clientNonce.size());
    computeHash.Write(serverNonce.data(), serverNonce.size());
    computeHash.Finalize(computedHash.data());
    return computedHash;
}